

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O1

void usage(_Bool standalone)

{
  undefined8 *puVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,standalone);
  if (iVar2 == 0) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  fwrite("Usage: puttygen ( keyfile | -t type [ -b bits ] )\n                [ -C comment ] [ -P ] [ -q ]\n                [ -o output-keyfile ] [ -O type | -l | -L | -p ]\n"
         ,0xa0,1,(FILE *)*puVar1);
  if (iVar2 != 0) {
    usage_cold_1();
  }
  return;
}

Assistant:

void usage(bool standalone)
{
    fprintf(standalone ? stderr : stdout,
            "Usage: puttygen ( keyfile | -t type [ -b bits ] )\n"
            "                [ -C comment ] [ -P ] [ -q ]\n"
            "                [ -o output-keyfile ] [ -O type | -l | -L"
            " | -p ]\n");
    if (standalone)
        fprintf(stderr,
                "Use \"puttygen --help\" for more detail.\n");
}